

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_query.c
# Opt level: O3

int dwarf_die_text(Dwarf_Die die,Dwarf_Half attrnum,char **ret_name,Dwarf_Error *error)

{
  Dwarf_Debug pDVar1;
  Dwarf_Attribute space;
  int iVar2;
  Dwarf_Signed errval;
  Dwarf_Error lerr;
  Dwarf_Attribute local_38;
  Dwarf_Error local_30;
  
  local_38 = (Dwarf_Attribute)0x0;
  local_30 = (Dwarf_Error)0x0;
  if (die == (Dwarf_Die)0x0) {
    errval = 0x34;
  }
  else {
    if (die->di_cu_context != (Dwarf_CU_Context_conflict)0x0) {
      pDVar1 = die->di_cu_context->cc_dbg;
      if ((pDVar1 == (Dwarf_Debug)0x0) || (pDVar1->de_magic != 0xebfdebfd)) {
        _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                            "DW_DLE_DBG_NULL: accesing a cu context, Dwarf_Debug either null or it containsa stale Dwarf_Debug pointer"
                           );
        return 1;
      }
      iVar2 = dwarf_attr(die,attrnum,&local_38,&local_30);
      space = local_38;
      if (iVar2 == -1) {
        return -1;
      }
      if (iVar2 != 1) {
        pDVar1 = die->di_cu_context->cc_dbg;
        iVar2 = dwarf_formstring(local_38,ret_name,error);
        dwarf_dealloc(pDVar1,space,10);
        return iVar2;
      }
      return -1;
    }
    errval = 0x68;
  }
  _dwarf_error((Dwarf_Debug)0x0,error,errval);
  return 1;
}

Assistant:

int
dwarf_die_text(Dwarf_Die die,
    Dwarf_Half   attrnum,
    char       **ret_name,
    Dwarf_Error *error)
{
    Dwarf_Debug dbg = 0;
    int res = DW_DLV_ERROR;
    Dwarf_Attribute attr = 0;
    Dwarf_Error lerr = 0;

    CHECK_DIE(die, DW_DLV_ERROR);

    res = dwarf_attr(die,attrnum,&attr,&lerr);
    dbg = die->di_cu_context->cc_dbg;
    if (res == DW_DLV_ERROR) {
        return DW_DLV_NO_ENTRY;
    }
    if (res == DW_DLV_NO_ENTRY) {
        return res;
    }
    res = dwarf_formstring(attr,ret_name,error);
    dwarf_dealloc(dbg,attr, DW_DLA_ATTR);
    attr = 0;
    return res;
}